

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ResolveSelectNames(Parse *pParse,Select *p,NameContext *pOuterNC)

{
  undefined1 local_50 [8];
  Walker w;
  NameContext *pOuterNC_local;
  Select *p_local;
  Parse *pParse_local;
  
  w.pParse = (Parse *)resolveExprStep;
  w.xExprCallback = resolveSelectStep;
  w.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
  local_50 = (undefined1  [8])pParse;
  w._32_8_ = pOuterNC;
  w.u.pNC = pOuterNC;
  sqlite3WalkSelect((Walker *)local_50,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ResolveSelectNames(
  Parse *pParse,         /* The parser context */
  Select *p,             /* The SELECT statement being coded. */
  NameContext *pOuterNC  /* Name context for parent SELECT statement */
){
  Walker w;

  assert( p!=0 );
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.pParse = pParse;
  w.u.pNC = pOuterNC;
  sqlite3WalkSelect(&w, p);
}